

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit(BinBinaryReader *this,Map *value)

{
  Type *pTVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  char *pos;
  bool bVar6;
  byte bVar7;
  ssize_t sVar8;
  reference value_00;
  PairList *pPVar9;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  uint *pos_00;
  char *pcVar10;
  long lVar11;
  long lVar12;
  
  pos_00 = (uint *)(this->reader).cur_;
  sVar8 = BinaryReader::read(&this->reader,(int)value,in_RDX,in_RCX);
  if ((char)sVar8 == '\0') {
    pcVar10 = "reader.read(value.keyType)";
  }
  else {
    pos_00 = (uint *)(this->reader).cur_;
    if ((char)value->keyType < '\0') {
      pcVar10 = "ValueHelper::is_primitive(value.keyType)";
    }
    else {
      pTVar1 = &value->valueType;
      sVar8 = BinaryReader::read(&this->reader,(int)pTVar1,__buf,in_RCX);
      if ((char)sVar8 == '\0') {
        pcVar10 = "reader.read(value.valueType)";
      }
      else {
        pos_00 = (uint *)(this->reader).cur_;
        bVar6 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                ::is_container(*pTVar1);
        if (bVar6) {
          pcVar10 = "!ValueHelper::is_container(value.valueType)";
        }
        else {
          pos_00 = (uint *)(this->reader).cur_;
          puVar5 = (uint *)(this->reader).cap_;
          puVar2 = pos_00 + 1;
          if (puVar5 < puVar2) {
            pcVar10 = "reader.read(size)";
          }
          else {
            uVar3 = *pos_00;
            (this->reader).cur_ = (char *)puVar2;
            if (puVar5 < pos_00 + 2) {
              pcVar10 = "reader.read(count)";
              pos_00 = puVar2;
            }
            else {
              pcVar10 = (this->reader).beg_;
              uVar4 = *puVar2;
              (this->reader).cur_ = (char *)(pos_00 + 2);
              lVar11 = (ulong)uVar4 + 1;
              pPVar9 = &value->items;
              do {
                bVar7 = (byte)pPVar9;
                lVar11 = lVar11 + -1;
                if (lVar11 == 0) {
                  pos = (this->reader).cur_;
                  lVar11 = (long)pos - (long)(this->reader).beg_;
                  lVar12 = (long)puVar2 + ((ulong)uVar3 - (long)pcVar10);
                  if (lVar11 != lVar12) {
                    bVar7 = fail_msg(this,"reader.position() == position + size",pos);
                  }
                  return (bool)(lVar11 == lVar12 | bVar7 & 1);
                }
                value_00 = std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::
                           emplace_back<>(&value->items);
                pos_00 = (uint *)(this->reader).cur_;
                bVar6 = read_value_of(this,&value_00->key,value->keyType);
                if (!bVar6) {
                  pcVar10 = "read_value_of(key, value.keyType)";
                  goto LAB_001148e0;
                }
                pos_00 = (uint *)(this->reader).cur_;
                bVar6 = read_value_of(this,&value_00->value,*pTVar1);
                pPVar9 = (PairList *)(ulong)bVar6;
              } while (bVar6);
              pcVar10 = "read_value_of(item, value.valueType)";
            }
          }
        }
      }
    }
  }
LAB_001148e0:
  bVar6 = fail_msg(this,pcVar10,(char *)pos_00);
  return bVar6;
}

Assistant:

bool read_value_visit(Map& value) noexcept {
            uint32_t size = 0;
            uint32_t count = 0;
            bin_assert(reader.read(value.keyType));
            bin_assert(ValueHelper::is_primitive(value.keyType));
            bin_assert(reader.read(value.valueType));
            bin_assert(!ValueHelper::is_container(value.valueType));
            bin_assert(reader.read(size));
            size_t position = reader.position();
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [key, item] = value.items.emplace_back();
                bin_assert(read_value_of(key, value.keyType));
                bin_assert(read_value_of(item, value.valueType));
            }
            bin_assert(reader.position() == position + size);
            return true;
        }